

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O3

void __thiscall QCborStreamReaderPrivate::preread(QCborStreamReaderPrivate *this)

{
  QByteArray *this_00;
  int iVar1;
  undefined4 extraout_var;
  char *__file;
  long lVar2;
  __off_t __length;
  
  if ((this->device != (QIODevice *)0x0) && ((this->buffer).d.size - this->bufferStart < 9)) {
    iVar1 = (*(this->device->super_QObject)._vptr_QObject[0x14])();
    lVar2 = (this->buffer).d.size;
    if (CONCAT44(extraout_var,iVar1) != lVar2) {
      if (this->bufferStart != 0) {
        QIODevice::skip(this->device,this->bufferStart);
        lVar2 = (this->buffer).d.size;
      }
      this_00 = &this->buffer;
      if (lVar2 != 0x100) {
        QByteArray::resize(this_00,0x100);
      }
      this->bufferStart = 0;
      __file = (char *)QIODevice::peek(this->device,(this->buffer).d.ptr,0x100);
      if ((long)__file < 0) {
        QByteArray::clear(this_00);
        return;
      }
      if (__file != (char *)0x100) {
        QByteArray::truncate(this_00,__file,__length);
        return;
      }
    }
  }
  return;
}

Assistant:

void preread()
    {
        if (device && buffer.size() - bufferStart < MaxCborIndividualSize) {
            // load more, but only if there's more to be read
            qint64 avail = device->bytesAvailable();
            Q_ASSERT(avail >= buffer.size());
            if (avail == buffer.size())
                return;

            if (bufferStart)
                device->skip(bufferStart);  // skip what we've already parsed

            if (buffer.size() != IdealIoBufferSize)
                buffer.resize(IdealIoBufferSize);

            bufferStart = 0;
            qint64 read = device->peek(bufferPtr(), IdealIoBufferSize);
            if (read < 0)
                buffer.clear();
            else if (read != IdealIoBufferSize)
                buffer.truncate(read);
        }
    }